

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WFXMLScanner.cpp
# Opt level: O1

void __thiscall xercesc_4_0::WFXMLScanner::scanReset(WFXMLScanner *this,InputSource *src)

{
  ReaderMgr *this_00;
  XMLDocumentHandler *pXVar1;
  XMLEntityHandler *pXVar2;
  XMLErrorReporter *pXVar3;
  SecurityManager *pSVar4;
  int iVar5;
  XMLReader *reader;
  XMLSize_t XVar6;
  RuntimeException *this_01;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  pXVar1 = (this->super_XMLScanner).fDocHandler;
  if (pXVar1 != (XMLDocumentHandler *)0x0) {
    (*pXVar1->_vptr_XMLDocumentHandler[9])();
  }
  pXVar2 = (this->super_XMLScanner).fEntityHandler;
  if (pXVar2 != (XMLEntityHandler *)0x0) {
    (*pXVar2->_vptr_XMLEntityHandler[4])();
  }
  pXVar3 = (this->super_XMLScanner).fErrorReporter;
  if (pXVar3 != (XMLErrorReporter *)0x0) {
    (*pXVar3->_vptr_XMLErrorReporter[3])();
  }
  ElemStack::reset(&(this->super_XMLScanner).fElemStack,(this->super_XMLScanner).fEmptyNamespaceId,
                   (this->super_XMLScanner).fUnknownNamespaceId,
                   (this->super_XMLScanner).fXMLNamespaceId,
                   (this->super_XMLScanner).fXMLNSNamespaceId);
  (this->super_XMLScanner).fInException = false;
  (this->super_XMLScanner).fStandalone = false;
  (this->super_XMLScanner).fErrorCount = 0;
  (this->super_XMLScanner).fHasNoDTD = true;
  this->fElementIndex = 0;
  RefHashTableOf<xercesc_4_0::XMLElementDecl,_xercesc_4_0::StringHasher>::removeAll
            (this->fElementLookup);
  this_00 = &(this->super_XMLScanner).fReaderMgr;
  reader = ReaderMgr::createReader
                     (this_00,src,true,RefFrom_NonLiteral,Type_General,Source_External,
                      (this->super_XMLScanner).fCalculateSrcOfs,
                      (this->super_XMLScanner).fLowWaterMark);
  if (reader != (XMLReader *)0x0) {
    ReaderMgr::pushReader(this_00,reader,(XMLEntityDecl *)0x0);
    pSVar4 = (this->super_XMLScanner).fSecurityManager;
    if (pSVar4 != (SecurityManager *)0x0) {
      XVar6 = (**(code **)(*(long *)pSVar4 + 0x18))();
      (this->super_XMLScanner).fEntityExpansionLimit = XVar6;
      (this->super_XMLScanner).fEntityExpansionCount = 0;
    }
    return;
  }
  iVar5 = (*src->_vptr_InputSource[6])(src);
  this_01 = (RuntimeException *)__cxa_allocate_exception(0x30);
  if ((char)iVar5 == '\0') {
    iVar5 = (*src->_vptr_InputSource[5])(src);
    RuntimeException::RuntimeException
              (this_01,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/WFXMLScanner.cpp"
               ,500,Scan_CouldNotOpenSource_Warning,(XMLCh *)CONCAT44(extraout_var_00,iVar5),
               (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,(this->super_XMLScanner).fMemoryManager);
  }
  else {
    iVar5 = (*src->_vptr_InputSource[5])(src);
    RuntimeException::RuntimeException
              (this_01,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/WFXMLScanner.cpp"
               ,0x1f2,Scan_CouldNotOpenSource,(XMLCh *)CONCAT44(extraout_var,iVar5),(XMLCh *)0x0,
               (XMLCh *)0x0,(XMLCh *)0x0,(this->super_XMLScanner).fMemoryManager);
  }
  __cxa_throw(this_01,&RuntimeException::typeinfo,XMLException::~XMLException);
}

Assistant:

void WFXMLScanner::scanReset(const InputSource& src)
{
    //  For all installed handlers, send reset events. This gives them
    //  a chance to flush any cached data.
    if (fDocHandler)
        fDocHandler->resetDocument();
    if (fEntityHandler)
        fEntityHandler->resetEntities();
    if (fErrorReporter)
        fErrorReporter->resetErrors();

    //  Reset the element stack, and give it the latest ids for the special
    //  URIs it has to know about.
    fElemStack.reset
    (
        fEmptyNamespaceId
        , fUnknownNamespaceId
        , fXMLNamespaceId
        , fXMLNSNamespaceId
    );

    // Reset some status flags
    fInException = false;
    fStandalone = false;
    fErrorCount = 0;
    fHasNoDTD = true;
    fElementIndex = 0;

    // Reset elements lookup table
    fElementLookup->removeAll();

    //  Handle the creation of the XML reader object for this input source.
    //  This will provide us with transcoding and basic lexing services.
    XMLReader* newReader = fReaderMgr.createReader
    (
        src
        , true
        , XMLReader::RefFrom_NonLiteral
        , XMLReader::Type_General
        , XMLReader::Source_External
        , fCalculateSrcOfs
        , fLowWaterMark
    );

    if (!newReader) {
        if (src.getIssueFatalErrorIfNotFound())
            ThrowXMLwithMemMgr1(RuntimeException, XMLExcepts::Scan_CouldNotOpenSource, src.getSystemId(), fMemoryManager);
        else
            ThrowXMLwithMemMgr1(RuntimeException, XMLExcepts::Scan_CouldNotOpenSource_Warning, src.getSystemId(), fMemoryManager);
    }

    // Push this read onto the reader manager
    fReaderMgr.pushReader(newReader, 0);

    // and reset security-related things if necessary:
    if(fSecurityManager != 0) 
    {
        fEntityExpansionLimit = fSecurityManager->getEntityExpansionLimit();
        fEntityExpansionCount = 0;
    }
}